

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabuilders_p.h
# Opt level: O2

Error __thiscall
asmjit::v1_14::RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder>::shareAssignmentAcrossSuccessors
          (RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *this,RABlock *block)

{
  uint uVar1;
  long lVar2;
  RABlock *pRVar3;
  uint32_t uVar4;
  Error EVar5;
  RABlock **ppRVar6;
  uint *puVar7;
  uint uVar8;
  RABlock *pRVar9;
  long lVar10;
  uint32_t sharedAssignmentId;
  uint32_t local_44;
  RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *local_40;
  ZoneVector<unsigned_int> *local_38;
  
  uVar8 = *(uint *)(block + 0x70);
  if (1 < uVar8) {
    local_40 = this;
    if (((byte)block[0xd] & 2) == 0) {
      pRVar9 = (RABlock *)0x0;
    }
    else {
      ppRVar6 = ZoneVector<asmjit::v1_14::RABlock_*>::operator[]
                          ((ZoneVector<asmjit::v1_14::RABlock_*> *)(block + 0x68),0);
      pRVar9 = *ppRVar6;
      uVar8 = *(uint *)(block + 0x70);
    }
    local_44 = 0xffffffff;
    lVar2 = *(long *)(block + 0x68);
    local_38 = &local_40->_sharedAssignmentsMap;
    for (lVar10 = 0; uVar4 = local_44, (ulong)uVar8 << 3 != lVar10; lVar10 = lVar10 + 8) {
      pRVar3 = *(RABlock **)(lVar2 + lVar10);
      uVar1 = local_44;
      if (pRVar3 != pRVar9) {
        uVar1 = *(uint *)(pRVar3 + 0xb8);
        if ((ulong)uVar1 == 0xffffffff) {
          if ((local_44 == 0xffffffff) &&
             (EVar5 = newSharedAssignmentId(local_40,&local_44), EVar5 != 0)) {
            return EVar5;
          }
          *(uint32_t *)(pRVar3 + 0xb8) = local_44;
          uVar1 = local_44;
        }
        else if (local_44 != 0xffffffff) {
          puVar7 = ZoneVector<unsigned_int>::operator[](local_38,(ulong)uVar1);
          *puVar7 = uVar4;
          uVar1 = local_44;
        }
      }
      local_44 = uVar1;
    }
  }
  return 0;
}

Assistant:

Error shareAssignmentAcrossSuccessors(RABlock* block) noexcept {
    if (block->successors().size() <= 1)
      return kErrorOk;

    RABlock* consecutive = block->consecutive();
    uint32_t sharedAssignmentId = Globals::kInvalidId;

    for (RABlock* successor : block->successors()) {
      if (successor == consecutive)
        continue;

      if (successor->hasSharedAssignmentId()) {
        if (sharedAssignmentId == Globals::kInvalidId)
          sharedAssignmentId = successor->sharedAssignmentId();
        else
          _sharedAssignmentsMap[successor->sharedAssignmentId()] = sharedAssignmentId;
      }
      else {
        if (sharedAssignmentId == Globals::kInvalidId)
          ASMJIT_PROPAGATE(newSharedAssignmentId(&sharedAssignmentId));
        successor->setSharedAssignmentId(sharedAssignmentId);
      }
    }
    return kErrorOk;
  }